

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testIdentifyType(int count)

{
  long lVar1;
  MsgType local_200;
  int local_1a4;
  long lStack_1a0;
  int i;
  long start;
  undefined1 local_188 [8];
  string messageString;
  Heartbeat message;
  int count_local;
  
  FIX42::Heartbeat::Heartbeat((Heartbeat *)(&messageString.field_2._M_allocated_capacity + 1));
  FIX::Message::toString_abi_cxx11_
            ((int)local_188,(int)(Heartbeat *)(&messageString.field_2._M_allocated_capacity + 1),8);
  lStack_1a0 = GetTickCount();
  for (local_1a4 = 0; local_1a4 <= count + -1; local_1a4 = local_1a4 + 1) {
    FIX::identifyType(&local_200,(string *)local_188);
    FIX::MsgType::~MsgType(&local_200);
  }
  lVar1 = GetTickCount();
  lVar1 = lVar1 - lStack_1a0;
  std::__cxx11::string::~string((string *)local_188);
  FIX42::Heartbeat::~Heartbeat((Heartbeat *)((long)&messageString.field_2 + 8));
  return lVar1;
}

Assistant:

long testIdentifyType(int count) {
  FIX42::Heartbeat message;
  std::string messageString = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::identifyType(messageString);
  }

  return GetTickCount() - start;
}